

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_api.c
# Opt level: O0

WORD32 ihevcd_ctl(iv_obj_t *ps_codec_obj,void *pv_api_ip,void *pv_api_op)

{
  int iVar1;
  codec_t *ps_codec_00;
  IV_API_CALL_STATUS_T IVar2;
  void *in_RDX;
  void *in_RSI;
  iv_obj_t *in_RDI;
  IV_API_CALL_STATUS_T ret_1;
  ivd_ctl_getversioninfo_op_t *ps_op;
  ivd_ctl_getversioninfo_ip_t *ps_ip;
  ivd_ctl_set_config_op_t *s_ctl_dynparams_op;
  codec_t *ps_codec;
  WORD32 subcommand;
  WORD32 ret;
  ivd_ctl_set_config_op_t *ps_ctl_op;
  ivd_ctl_set_config_ip_t *ps_ctl_ip;
  UWORD32 in_stack_000001b4;
  CHAR *in_stack_000001b8;
  undefined4 in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffa8;
  iv_obj_t *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  WORD32 local_34;
  WORD32 local_4;
  
  local_34 = 0;
  ps_codec_00 = (codec_t *)in_RDI->pv_codec_handle;
  if (ps_codec_00->i4_init_done == 1) {
    iVar1 = *(int *)((long)in_RSI + 8);
    if (iVar1 == 0) {
      local_34 = ihevcd_get_status(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 1) {
      local_34 = ihevcd_set_params(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 2) {
      local_34 = ihevcd_reset(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                              (void *)CONCAT44(in_stack_ffffffffffffffa4,2));
    }
    else if (iVar1 == 3) {
      local_34 = ihevcd_set_default_params(ps_codec_00);
      if (local_34 == 0) {
        *(undefined4 *)((long)in_RDX + 4) = 0;
      }
    }
    else if (iVar1 == 4) {
      local_34 = ihevcd_set_flush_mode(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 5) {
      local_34 = ihevcd_get_buf_info(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 6) {
      *(undefined4 *)((long)in_RDX + 4) = 0;
      if (*(int *)((long)in_RSI + 0x18) < 1) {
        *(undefined4 *)((long)in_RDX + 4) = 0xd9;
      }
      else {
        IVar2 = ihevcd_get_version(in_stack_000001b8,in_stack_000001b4);
        if (IVar2 != IV_SUCCESS) {
          *(undefined4 *)((long)in_RDX + 4) = 0xd9;
        }
      }
    }
    else if (iVar1 == 7) {
      local_34 = ihevcd_set_num_cores(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 8) {
      local_34 = ihevcd_set_processor
                           ((iv_obj_t *)ps_codec_00,in_stack_ffffffffffffffb8,
                            in_stack_ffffffffffffffb0);
    }
    else if (iVar1 == 0x107) {
      local_34 = ihevcd_get_frame_dimensions(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 0x108) {
      local_34 = ihevcd_get_vui_params(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 0x109) {
      local_34 = ihevcd_get_sei_mastering_params(in_RDI,in_RSI,in_RDX);
    }
    else if (iVar1 == 0x307) {
      local_34 = ihevcd_set_degrade(in_RDI,in_RSI,in_RDX);
    }
    local_4 = local_34;
  }
  else {
    *(uint *)((long)in_RDX + 4) = *(uint *)((long)in_RDX + 4) | 0x4000;
    *(uint *)((long)in_RDX + 4) = *(uint *)((long)in_RDX + 4) | 0xd0;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

WORD32 ihevcd_ctl(iv_obj_t *ps_codec_obj, void *pv_api_ip, void *pv_api_op)
{
    ivd_ctl_set_config_ip_t *ps_ctl_ip;
    ivd_ctl_set_config_op_t *ps_ctl_op;
    WORD32 ret = 0;
    WORD32 subcommand;
    codec_t *ps_codec = (codec_t *)ps_codec_obj->pv_codec_handle;

    ps_ctl_ip = (ivd_ctl_set_config_ip_t *)pv_api_ip;
    ps_ctl_op = (ivd_ctl_set_config_op_t *)pv_api_op;

    if(ps_codec->i4_init_done != 1)
    {
        ps_ctl_op->u4_error_code |= 1 << IVD_FATALERROR;
        ps_ctl_op->u4_error_code |= IHEVCD_INIT_NOT_DONE;
        return IV_FAIL;
    }
    subcommand = ps_ctl_ip->e_sub_cmd;

    switch(subcommand)
    {
        case IVD_CMD_CTL_GETPARAMS:
            ret = ihevcd_get_status(ps_codec_obj, (void *)pv_api_ip,
                                    (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_SETPARAMS:
            ret = ihevcd_set_params(ps_codec_obj, (void *)pv_api_ip,
                                    (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_RESET:
            ret = ihevcd_reset(ps_codec_obj, (void *)pv_api_ip,
                               (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_SETDEFAULT:
        {
            ivd_ctl_set_config_op_t *s_ctl_dynparams_op =
                            (ivd_ctl_set_config_op_t *)pv_api_op;

            ret = ihevcd_set_default_params(ps_codec);
            if(IV_SUCCESS == ret)
                s_ctl_dynparams_op->u4_error_code = 0;
            break;
        }
        case IVD_CMD_CTL_FLUSH:
            ret = ihevcd_set_flush_mode(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_GETBUFINFO:
            ret = ihevcd_get_buf_info(ps_codec_obj, (void *)pv_api_ip,
                                      (void *)pv_api_op);
            break;
        case IVD_CMD_CTL_GETVERSION:
        {
            ivd_ctl_getversioninfo_ip_t *ps_ip;
            ivd_ctl_getversioninfo_op_t *ps_op;
            IV_API_CALL_STATUS_T ret;
            ps_ip = (ivd_ctl_getversioninfo_ip_t *)pv_api_ip;
            ps_op = (ivd_ctl_getversioninfo_op_t *)pv_api_op;

            ps_op->u4_error_code = IV_SUCCESS;

            if((WORD32)ps_ip->u4_version_buffer_size <= 0)
            {
                ps_op->u4_error_code = IHEVCD_CXA_VERS_BUF_INSUFFICIENT;
                ret = IV_FAIL;
            }
            else
            {
                ret = ihevcd_get_version((CHAR *)ps_ip->pv_version_buffer,
                                         ps_ip->u4_version_buffer_size);
                if(ret != IV_SUCCESS)
                {
                    ps_op->u4_error_code = IHEVCD_CXA_VERS_BUF_INSUFFICIENT;
                    ret = IV_FAIL;
                }
            }
        }
            break;
        case IHEVCD_CXA_CMD_CTL_DEGRADE:
            ret = ihevcd_set_degrade(ps_codec_obj, (void *)pv_api_ip,
                            (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_SET_NUM_CORES:
            ret = ihevcd_set_num_cores(ps_codec_obj, (void *)pv_api_ip,
                                       (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_BUFFER_DIMENSIONS:
            ret = ihevcd_get_frame_dimensions(ps_codec_obj, (void *)pv_api_ip,
                                              (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_VUI_PARAMS:
            ret = ihevcd_get_vui_params(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_GET_SEI_MASTERING_PARAMS:
            ret = ihevcd_get_sei_mastering_params(ps_codec_obj, (void *)pv_api_ip,
                                        (void *)pv_api_op);
            break;
        case IHEVCD_CXA_CMD_CTL_SET_PROCESSOR:
            ret = ihevcd_set_processor(ps_codec_obj, (void *)pv_api_ip,
                            (void *)pv_api_op);
            break;
        default:
            DEBUG("\nDo nothing\n");
            break;
    }

    return ret;
}